

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uresbund.cpp
# Opt level: O0

UEnumeration * ures_getKeywordValues_63(char *path,char *keyword,UErrorCode *status)

{
  UBool UVar1;
  int iVar2;
  UEnumeration *en;
  size_t sVar3;
  bool bVar4;
  int local_1a0c;
  int32_t kLen;
  int32_t i;
  char *k;
  UResourceBundle *pUStack_19f8;
  UErrorCode subStatus;
  UResourceBundle *subPtr;
  UResourceBundle *bund;
  UResourceBundle subItem;
  UResourceBundle item;
  UEnumeration *locs;
  char *pcStack_1848;
  int32_t locLen;
  char *locale;
  int32_t valuesCount;
  char *valuesList [512];
  int local_82c;
  char local_828 [4];
  int32_t valuesIndex;
  char valuesBuf [2048];
  UErrorCode *status_local;
  char *keyword_local;
  char *path_local;
  
  local_82c = 0;
  locale._4_4_ = 0;
  valuesBuf._2040_8_ = status;
  ures_initStackObject_63((UResourceBundle *)&subItem.fSize);
  ures_initStackObject_63((UResourceBundle *)&bund);
  en = ures_openAvailableLocales_63(path,(UErrorCode *)valuesBuf._2040_8_);
  UVar1 = U_FAILURE(*(UErrorCode *)valuesBuf._2040_8_);
  if (UVar1 == '\0') {
    local_828[0] = '\0';
    local_828[1] = 0;
    while (pcStack_1848 = uenum_next_63(en,(int32_t *)((long)&locs + 4),
                                        (UErrorCode *)valuesBuf._2040_8_),
          pcStack_1848 != (char *)0x0) {
      subPtr = (UResourceBundle *)0x0;
      pUStack_19f8 = (UResourceBundle *)0x0;
      k._4_4_ = U_ZERO_ERROR;
      subPtr = ures_openDirect_63(path,pcStack_1848,(UErrorCode *)((long)&k + 4));
      ures_getByKey_63(subPtr,keyword,(UResourceBundle *)&subItem.fSize,(UErrorCode *)((long)&k + 4)
                      );
      if ((subPtr == (UResourceBundle *)0x0) || (UVar1 = U_FAILURE(k._4_4_), UVar1 != '\0')) {
        ures_close_63(subPtr);
        subPtr = (UResourceBundle *)0x0;
      }
      else {
        while( true ) {
          pUStack_19f8 = ures_getNextResource_63
                                   ((UResourceBundle *)&subItem.fSize,(UResourceBundle *)&bund,
                                    (UErrorCode *)((long)&k + 4));
          bVar4 = false;
          if (pUStack_19f8 != (UResourceBundle *)0x0) {
            UVar1 = U_SUCCESS(k._4_4_);
            bVar4 = UVar1 != '\0';
          }
          if (!bVar4) break;
          _kLen = ures_getKey_63(pUStack_19f8);
          if ((((_kLen != (char *)0x0) && (*_kLen != '\0')) &&
              (iVar2 = strcmp(_kLen,"default"), iVar2 != 0)) &&
             (iVar2 = strncmp(_kLen,"private-",8), iVar2 != 0)) {
            for (local_1a0c = 0; local_1a0c < locale._4_4_; local_1a0c = local_1a0c + 1) {
              iVar2 = strcmp(*(char **)(&stack0xffffffffffffe7c8 + (long)local_1a0c * 8),_kLen);
              if (iVar2 == 0) {
                _kLen = (char *)0x0;
                break;
              }
            }
            if (_kLen != (char *)0x0) {
              sVar3 = strlen(_kLen);
              if ((locale._4_4_ < 0x1ff) && (local_82c + (int)sVar3 + 2 < 0x800)) {
                strcpy(local_828 + local_82c,_kLen);
                *(char **)(&stack0xffffffffffffe7c8 + (long)locale._4_4_ * 8) =
                     local_828 + local_82c;
                iVar2 = (int)sVar3 + local_82c;
                local_82c = iVar2 + 1;
                local_828[iVar2] = '\0';
                locale._4_4_ = locale._4_4_ + 1;
              }
              else {
                *(undefined4 *)valuesBuf._2040_8_ = 1;
              }
            }
          }
        }
        ures_close_63(subPtr);
      }
    }
    local_828[local_82c] = '\0';
    ures_close_63((UResourceBundle *)&subItem.fSize);
    ures_close_63((UResourceBundle *)&bund);
    uenum_close_63(en);
    path_local = (char *)uloc_openKeywordList_63
                                   (local_828,local_82c + 1,(UErrorCode *)valuesBuf._2040_8_);
  }
  else {
    ures_close_63((UResourceBundle *)&subItem.fSize);
    ures_close_63((UResourceBundle *)&bund);
    path_local = (char *)0x0;
  }
  return (UEnumeration *)path_local;
}

Assistant:

U_CAPI UEnumeration* U_EXPORT2
ures_getKeywordValues(const char *path, const char *keyword, UErrorCode *status)
{
#define VALUES_BUF_SIZE 2048
#define VALUES_LIST_SIZE 512
    
    char       valuesBuf[VALUES_BUF_SIZE];
    int32_t    valuesIndex = 0;
    const char *valuesList[VALUES_LIST_SIZE];
    int32_t    valuesCount = 0;
    
    const char *locale;
    int32_t     locLen;
    
    UEnumeration *locs = NULL;
    
    UResourceBundle    item;
    UResourceBundle    subItem;
    
    ures_initStackObject(&item);
    ures_initStackObject(&subItem);
    locs = ures_openAvailableLocales(path, status);
    
    if(U_FAILURE(*status)) {
        ures_close(&item);
        ures_close(&subItem);
        return NULL;
    }
    
    valuesBuf[0]=0;
    valuesBuf[1]=0;
    
    while((locale = uenum_next(locs, &locLen, status)) != 0) {
        UResourceBundle   *bund = NULL;
        UResourceBundle   *subPtr = NULL;
        UErrorCode subStatus = U_ZERO_ERROR; /* don't fail if a bundle is unopenable */
        bund = ures_openDirect(path, locale, &subStatus);
        
#if defined(URES_TREE_DEBUG)
        if(!bund || U_FAILURE(subStatus)) {
            fprintf(stderr, "%s-%s values: Can't open %s locale - skipping. (%s)\n", 
                path?path:"<ICUDATA>", keyword, locale, u_errorName(subStatus));
        }
#endif
        
        ures_getByKey(bund, keyword, &item, &subStatus);
        
        if(!bund || U_FAILURE(subStatus)) {
#if defined(URES_TREE_DEBUG)
            fprintf(stderr, "%s-%s values: Can't find in %s - skipping. (%s)\n", 
                path?path:"<ICUDATA>", keyword, locale, u_errorName(subStatus));
#endif
            ures_close(bund);
            bund = NULL;
            continue;
        }
        
        while((subPtr = ures_getNextResource(&item,&subItem,&subStatus)) != 0
            && U_SUCCESS(subStatus)) {
            const char *k;
            int32_t i;
            k = ures_getKey(subPtr);

#if defined(URES_TREE_DEBUG)
            /* fprintf(stderr, "%s | %s | %s | %s\n", path?path:"<ICUDATA>", keyword, locale, k); */
#endif
            if(k == NULL || *k == 0 ||
                    uprv_strcmp(k, DEFAULT_TAG) == 0 || uprv_strncmp(k, "private-", 8) == 0) {
                // empty or "default" or unlisted type
                continue;
            }
            for(i=0; i<valuesCount; i++) {
                if(!uprv_strcmp(valuesList[i],k)) {
                    k = NULL; /* found duplicate */
                    break;
                }
            }
            if(k != NULL) {
                int32_t kLen = (int32_t)uprv_strlen(k);
                if((valuesCount >= (VALUES_LIST_SIZE-1)) ||       /* no more space in list .. */
                    ((valuesIndex+kLen+1+1) >= VALUES_BUF_SIZE)) { /* no more space in buffer (string + 2 nulls) */
                    *status = U_ILLEGAL_ARGUMENT_ERROR; /* out of space.. */
                } else {
                    uprv_strcpy(valuesBuf+valuesIndex, k);
                    valuesList[valuesCount++] = valuesBuf+valuesIndex;
                    valuesIndex += kLen;
#if defined(URES_TREE_DEBUG)
                    fprintf(stderr, "%s | %s | %s | [%s]   (UNIQUE)\n",
                        path?path:"<ICUDATA>", keyword, locale, k);
#endif
                    valuesBuf[valuesIndex++] = 0; /* terminate */
                }
            }
        }
        ures_close(bund);
    }
    valuesBuf[valuesIndex++] = 0; /* terminate */
    
    ures_close(&item);
    ures_close(&subItem);
    uenum_close(locs);
#if defined(URES_TREE_DEBUG)
    fprintf(stderr, "%s:  size %d, #%d\n", u_errorName(*status), 
        valuesIndex, valuesCount);
#endif
    return uloc_openKeywordList(valuesBuf, valuesIndex, status);
}